

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O2

void __thiscall
minibag::Recorder::doQueue
          (Recorder *this,MessageEvent<const_miniros::topic_tools::ShapeShifter> *msg_event,
          string *topic,shared_ptr<miniros::Subscriber> *subscriber,shared_ptr<int> *count)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  Time _time;
  ostream *poVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  Time now;
  __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_108;
  MessageEvent<miniros::topic_tools::ShapeShifter_const> local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  allocator<char> local_e8 [8];
  OutgoingMessage out;
  TimeBase<miniros::Time,_miniros::Duration> local_98 [4];
  OutgoingMessage drop;
  
  _time.super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)miniros::Time::now();
  if ((this->options_).verbose == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Received message on topic ");
    miniros::Subscriber::getTopic_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)&out);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&out);
  }
  miniros::MessageEvent<miniros::topic_tools::ShapeShifter_const>::
  copyMessageIfNecessary<miniros::topic_tools::ShapeShifter_const>(local_f8);
  std::
  __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_108,
                 &(msg_event->connection_header_).
                  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  OutgoingMessage::OutgoingMessage
            (&out,topic,(ConstPtr *)local_f8,
             (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_108,_time);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::mutex::lock(&this->queue_mutex_);
  std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>::push_back
            (&this->queue_->c,&out);
  uVar3 = miniros::topic_tools::ShapeShifter::size();
  uVar5 = (ulong)uVar3 + this->queue_size_;
  this->queue_size_ = uVar5;
  while ((uVar7 = (ulong)(this->options_).buffer_size, uVar7 != 0 && (uVar7 < uVar5))) {
    OutgoingMessage::OutgoingMessage
              (&drop,(this->queue_->c).
                     super__Deque_base<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::deque<minibag::OutgoingMessage,_std::allocator<minibag::OutgoingMessage>_>::pop_front
              (&this->queue_->c);
    uVar3 = miniros::topic_tools::ShapeShifter::size();
    this->queue_size_ = this->queue_size_ - (ulong)uVar3;
    if ((this->options_).snapshot == false) {
      now.super_TimeBase<miniros::Time,_miniros::Duration> =
           (TimeBase<miniros::Time,_miniros::Duration>)miniros::Time::now();
      miniros::Duration::Duration((Duration *)local_e8,5.0);
      local_98[0] = (TimeBase<miniros::Time,_miniros::Duration>)
                    miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
                              (&(this->last_buffer_warn_).
                                super_TimeBase<miniros::Time,_miniros::Duration>,
                               (Duration *)local_e8);
      bVar2 = miniros::TimeBase<miniros::Time,_miniros::Duration>::operator>
                        (&now.super_TimeBase<miniros::Time,_miniros::Duration>,(Time *)local_98);
      if (bVar2) {
        if ((char)miniros::console::g_initialized == '\0') {
          miniros::console::initialize();
        }
        if (doQueue::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,"miniros.unknown_package",local_e8);
          miniros::console::initializeLogLocation(&doQueue::loc,(string *)local_98,Warn);
          std::__cxx11::string::~string((string *)local_98);
        }
        if (doQueue::loc.level_ != Warn) {
          miniros::console::setLogLocationLevel(&doQueue::loc,Warn);
          miniros::console::checkLogLocationEnabled(&doQueue::loc);
        }
        if (doQueue::loc.logger_enabled_ == true) {
          miniros::console::print
                    ((FilterBase *)0x0,doQueue::loc.logger_,doQueue::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
                     ,0x111,
                     "void minibag::Recorder::doQueue(const miniros::MessageEvent<const miniros::topic_tools::ShapeShifter> &, const string &, shared_ptr<miniros::Subscriber>, shared_ptr<int>)"
                     ,"rosbag record buffer exceeded.  Dropping oldest queued message.");
        }
        (this->last_buffer_warn_).super_TimeBase<miniros::Time,_miniros::Duration> =
             now.super_TimeBase<miniros::Time,_miniros::Duration>;
      }
    }
    OutgoingMessage::~OutgoingMessage(&drop);
    uVar5 = this->queue_size_;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
  if ((this->options_).snapshot == false) {
    std::_V2::condition_variable_any::notify_all(&this->queue_condition_);
  }
  piVar1 = (count->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar6 = *piVar1;
  if ((0 < iVar6) && (iVar6 = iVar6 + -1, *piVar1 = iVar6, iVar6 == 0)) {
    miniros::Subscriber::shutdown();
    piVar1 = &this->num_subscribers_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      miniros::shutdown();
    }
  }
  OutgoingMessage::~OutgoingMessage(&out);
  return;
}

Assistant:

void Recorder::doQueue(const miniros::MessageEvent<miniros::topic_tools::ShapeShifter const>& msg_event,
  string const& topic, shared_ptr<miniros::Subscriber> subscriber, shared_ptr<int> count)
{
  miniros::Time rectime = miniros::Time::now();

  if (options_.verbose)
    cout << "Received message on topic " << subscriber->getTopic() << endl;

  OutgoingMessage out(topic, msg_event.getMessage(), msg_event.getConnectionHeaderPtr(), rectime);

  {
    std::scoped_lock<std::mutex> lock(queue_mutex_);

    queue_->push(out);
    queue_size_ += out.msg->size();

    // Check to see if buffer has been exceeded
    while (options_.buffer_size > 0 && queue_size_ > options_.buffer_size) {
      OutgoingMessage drop = queue_->front();
      queue_->pop();
      queue_size_ -= drop.msg->size();

      if (!options_.snapshot) {
        miniros::Time now = miniros::Time::now();
        if (now > last_buffer_warn_ + miniros::Duration(5.0)) {
          MINIROS_WARN("rosbag record buffer exceeded.  Dropping oldest queued message.");
          last_buffer_warn_ = now;
        }
      }
    }
  }

  if (!options_.snapshot)
    queue_condition_.notify_all();

  // If we are book-keeping count, decrement and possibly shutdown
  if ((*count) > 0) {
    (*count)--;
    if ((*count) == 0) {
      subscriber->shutdown();

      num_subscribers_--;

      if (num_subscribers_ == 0)
        miniros::shutdown();
    }
  }
}